

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<1536,unsigned_int>
               (hashfunc<unsigned_int> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar4;
  uint in_ESI;
  int in_R8D;
  bool result;
  uint h;
  keytype k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  uint32_t *in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef2;
  byte bVar5;
  undefined1 in_stack_fffffffffffffef3;
  undefined3 uVar6;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 uVar7;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  pfHash in_stack_ffffffffffffff10;
  Blob<1536> local_e8;
  undefined1 in_stack_ffffffffffffffdb;
  undefined1 in_stack_ffffffffffffffdc;
  undefined1 in_stack_ffffffffffffffdd;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffe0;
  hashfunc local_8 [8];
  
  uVar1 = in_EDX & 1;
  pcVar4 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x600,pcVar4,(ulong)in_ESI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x12af8f);
  Blob<1536>::Blob(&local_e8);
  memset(&local_e8,0,0xc0);
  if (uVar1 != 0) {
    hashfunc<unsigned_int>::operator()
              ((hashfunc<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff04,in_ESI),
               (void *)CONCAT44(in_EDX,in_ECX),in_R8D,
               CONCAT13(in_stack_fffffffffffffef3,
                        CONCAT12(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0)),
               in_stack_fffffffffffffee8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_ESI),
               (value_type_conflict1 *)CONCAT44(in_EDX,in_ECX));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<1536>,unsigned_int>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
             SUB41((uint)in_stack_ffffffffffffff04 >> 0x18,0),(Blob<1536> *)CONCAT44(in_EDX,in_ECX),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_R8D,CONCAT13(in_stack_fffffffffffffef3,
                                      CONCAT12(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0))
                     ));
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffffd8
                    );
  printf("%d keys\n",sVar3 & 0xffffffff);
  uVar6 = (undefined3)in_stack_ffffffffffffff04;
  bVar5 = 1;
  bVar2 = TestHashList<unsigned_int>
                    (in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf,
                     (bool)in_stack_ffffffffffffffde,(bool)in_stack_ffffffffffffffdd,
                     (bool)in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb);
  uVar7 = CONCAT13(bVar2 & bVar5,uVar6);
  printf("\n");
  bVar5 = (byte)((uint)uVar7 >> 0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(uVar7,in_ESI));
  return (bool)(bVar5 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}